

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QList<QPersistentModelIndexData_*>_>::eraseLast
          (QGenericArrayOps<QList<QPersistentModelIndexData_*>_> *this)

{
  QArrayDataPointer<QList<QPersistentModelIndexData_*>_> *in_RDI;
  
  QArrayDataPointer<QList<QPersistentModelIndexData_*>_>::end(in_RDI);
  QList<QPersistentModelIndexData_*>::~QList((QList<QPersistentModelIndexData_*> *)0x81d8e8);
  in_RDI->size = in_RDI->size + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }